

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

void __thiscall
absl::inlined_vector_internal::
Storage<absl::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::str_format_internal::FormatArgImpl>>
::
Initialize<absl::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,absl::str_format_internal::FormatArgImpl_const*>>
          (Storage<absl::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::str_format_internal::FormatArgImpl>>
           *this,IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,_const_absl::str_format_internal::FormatArgImpl_*>
                 values,SizeType<std::allocator<absl::str_format_internal::FormatArgImpl>_> new_size
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Data DVar5;
  undefined8 uVar6;
  FormatArgImpl *pFVar7;
  long lVar8;
  SizeType<std::allocator<absl::str_format_internal::FormatArgImpl>_> SVar9;
  ulong extraout_RDX;
  size_type __n;
  
  if ((*(ulong *)this & 1) == 0) {
    if (*(ulong *)this == 0) {
      if (new_size < 5) {
        pFVar7 = (FormatArgImpl *)(this + 8);
      }
      else {
        __n = 8;
        if (8 < new_size) {
          __n = new_size;
        }
        pFVar7 = __gnu_cxx::new_allocator<absl::str_format_internal::FormatArgImpl>::allocate
                           ((new_allocator<absl::str_format_internal::FormatArgImpl> *)this,__n,
                            (void *)0x0);
        *(FormatArgImpl **)(this + 8) = pFVar7;
        *(size_type *)(this + 0x10) = __n;
        *this = (Storage<absl::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::str_format_internal::FormatArgImpl>>
                 )((byte)*this | 1);
      }
      if (new_size != 0) {
        lVar8 = 0;
        SVar9 = new_size;
        do {
          puVar1 = (undefined8 *)((long)&(values.it_)->data_ + lVar8);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pFVar7->data_ + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar8 = lVar8 + 0x10;
          SVar9 = SVar9 - 1;
        } while (SVar9 != 0);
      }
      *(SizeType<std::allocator<absl::str_format_internal::FormatArgImpl>_> *)this =
           *(long *)this + new_size * 2;
      return;
    }
  }
  else {
    Initialize<absl::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,absl::str_format_internal::FormatArgImpl_const*>>
              ();
  }
  Initialize<absl::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::str_format_internal::FormatArgImpl>,absl::str_format_internal::FormatArgImpl_const*>>
            ();
  if ((ulong)values.it_ >> 0x3b == 0) {
    operator_new((long)values.it_ << 4);
    return;
  }
  pFVar7 = values.it_;
  __gnu_cxx::new_allocator<absl::str_format_internal::FormatArgImpl>::allocate
            ((new_allocator<absl::str_format_internal::FormatArgImpl> *)values.it_);
  if (extraout_RDX < 0x10) {
    (pFVar7->data_).buf[0] = (char)extraout_RDX * '\x02';
    if (extraout_RDX < 8) {
      if (extraout_RDX < 4) {
        if (extraout_RDX != 0) {
          (pFVar7->data_).buf[1] = ((values.it_)->data_).buf[0];
          (pFVar7->data_).buf[(extraout_RDX >> 1) + 1] =
               ((values.it_)->data_).buf[extraout_RDX >> 1];
          (pFVar7->data_).buf[extraout_RDX] = *(char *)((long)values.it_ + (extraout_RDX - 1));
        }
        pFVar7->dispatcher_ = (Dispatcher)0x0;
        *(undefined8 *)((long)&pFVar7->data_ + extraout_RDX + 1) = 0;
      }
      else {
        uVar3 = *(undefined4 *)&(values.it_)->data_;
        uVar4 = *(undefined4 *)((long)values.it_ + (extraout_RDX - 4));
        *(undefined4 *)((long)&pFVar7->data_ + 5) = 0;
        pFVar7->dispatcher_ = (Dispatcher)0x0;
        *(undefined4 *)((long)&pFVar7->data_ + 1) = uVar3;
        *(undefined4 *)((long)pFVar7 + (extraout_RDX - 3)) = uVar4;
      }
    }
    else {
      if (0xf < extraout_RDX) goto LAB_00173609;
      DVar5 = (values.it_)->data_;
      uVar6 = *(undefined8 *)((long)values.it_ + (extraout_RDX - 8));
      pFVar7->dispatcher_ = (Dispatcher)0x0;
      *(Data *)((long)&pFVar7->data_ + 1) = DVar5;
      *(undefined8 *)((long)pFVar7 + (extraout_RDX - 7)) = uVar6;
    }
    return;
  }
  cord_internal::InlineData::set_inline_data();
LAB_00173609:
  __assert_fail("n <= 15",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                ,0x61,
                "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = true]"
               );
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }